

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::PortConnection::ConnMap::ConnMap
          (ConnMap *this,SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *portConnections,
          Scope *scope,LookupLocation lookupLocation)

{
  LookupLocation lookupLocation_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  SourceRange sourceRange;
  bool bVar1;
  uint uVar2;
  NamedPortConnectionSyntax *this_00;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>
  *pSVar3;
  basic_string_view<char,_std::char_traits<char>_> *args_1;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *peVar4;
  pointer ppVar5;
  undefined8 in_RCX;
  undefined1 uVar6;
  Diagnostic *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  const_iterator cVar7;
  const_iterator cVar8;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar9;
  SourceRange SVar10;
  string_view sVar11;
  pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool> pVar12;
  Diagnostic *diag_1;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  pair;
  string_view name;
  NamedPortConnectionSyntax *npc;
  Diagnostic *diag;
  bool isOrdered;
  PortConnectionSyntax *conn;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *__range2;
  bool hasConnections;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb78;
  Diagnostic *in_stack_fffffffffffffb80;
  SourceLocation in_stack_fffffffffffffb88;
  Diagnostic *in_stack_fffffffffffffb90;
  Diagnostic *in_stack_fffffffffffffb98;
  SourceLocation in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  undefined4 in_stack_fffffffffffffbb0;
  DiagCode in_stack_fffffffffffffbb4;
  Diagnostic *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  SyntaxNode *in_stack_fffffffffffffbd0;
  SyntaxNode *args_2;
  SyntaxNode *args;
  undefined7 in_stack_fffffffffffffc08;
  Scope *in_stack_fffffffffffffc20;
  SourceLocation in_stack_fffffffffffffc28;
  Diagnostic *in_stack_fffffffffffffc30;
  DiagCode code;
  bool local_361;
  size_t local_350;
  Scope *this_01;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_290;
  SourceLocation local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_25c;
  SourceRange local_258;
  undefined4 local_244;
  Diagnostic *local_240;
  undefined8 local_238;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> local_218;
  SourceRange local_208;
  undefined1 local_1f1;
  Token local_1f0;
  SourceLocation local_1e0;
  undefined4 local_1d8;
  bool local_1d1;
  PortConnectionSyntax *local_1d0;
  const_iterator local_1c8;
  const_iterator local_1b8;
  undefined8 local_1a8;
  byte local_19d;
  Diagnostic *local_190;
  undefined8 local_188;
  undefined8 local_178;
  basic_string_view<char,_std::char_traits<char>_> *local_168;
  basic_string_view<char,_std::char_traits<char>_> *local_160;
  SyntaxNode *local_158;
  undefined1 local_149;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
  local_148;
  basic_string_view<char,_std::char_traits<char>_> *local_140;
  basic_string_view<char,_std::char_traits<char>_> *local_138;
  SyntaxNode *local_130;
  bool local_121 [25];
  iterator local_108;
  bool local_f1 [25];
  iterator local_d8;
  bool local_c1;
  iterator local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
  local_b0;
  size_t local_98;
  basic_string_view<char,_std::char_traits<char>_> *local_90;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 *local_70;
  SyntaxNode *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  SyntaxNode *local_8;
  
  local_190 = in_RDX;
  local_188 = in_RSI;
  local_178 = in_RCX;
  SmallVector<const_slang::syntax::PortConnectionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::PortConnectionSyntax_*,_5UL> *)0x7a883f);
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>,_8UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
              *)in_stack_fffffffffffffb90);
  std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)0x7a886e);
  SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffffb80);
  *(undefined1 *)(in_RDI + 0x1a0) = 1;
  *(undefined1 *)(in_RDI + 0x1a1) = 0;
  local_19d = 0;
  local_1a8 = local_188;
  cVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)0x7a88bf);
  local_1b8 = cVar7;
  cVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)0x7a88fe);
  local_1c8 = cVar8;
  do {
    local_350 = cVar8.index;
    this_01 = (Scope *)cVar8.list;
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffb80,
                       (iterator_base<const_slang::syntax::PortConnectionSyntax_*> *)
                       in_stack_fffffffffffffb78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_1d0 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
                             *)0x7a896d);
    code = SUB84((ulong)in_stack_fffffffffffffc30 >> 0x20,0);
    local_361 = true;
    if ((local_1d0->super_SyntaxNode).kind != OrderedPortConnection) {
      local_361 = (local_1d0->super_SyntaxNode).kind == EmptyPortConnection;
    }
    local_1d1 = local_361;
    if ((local_19d & 1) == 0) {
      local_19d = 1;
      *(bool *)(in_RDI + 0x1a0) = local_361;
    }
    else if (local_361 != (bool)(*(byte *)(in_RDI + 0x1a0) & 1)) {
      local_1d8 = 0x800006;
      local_1f0 = slang::syntax::SyntaxNode::getFirstToken
                            ((SyntaxNode *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_1e0 = parsing::Token::location(&local_1f0);
      Scope::addDiag(in_stack_fffffffffffffc20,code,in_stack_fffffffffffffc28);
      return;
    }
    if (local_361 == false) {
      if ((local_1d0->super_SyntaxNode).kind == WildcardPortConnection) {
        local_1f1 = 1;
        bVar1 = std::exchange<bool,bool>
                          ((bool *)in_stack_fffffffffffffb80,(bool *)in_stack_fffffffffffffb78);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_244 = 0x340006;
          SVar10 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffbd0);
          sourceRange.endLoc = (SourceLocation)cVar7.list;
          sourceRange.startLoc = (SourceLocation)cVar7.index;
          local_258 = SVar10;
          in_stack_fffffffffffffc30 =
               Scope::addDiag(this_01,SUB84((ulong)in_RDI >> 0x20,0),sourceRange);
          local_25c = 0xc0001;
          local_278 = *(undefined8 *)(in_RDI + 400);
          uStack_270 = *(undefined8 *)(in_RDI + 0x198);
          SVar10.endLoc._0_7_ = in_stack_fffffffffffffba8;
          SVar10.startLoc = in_stack_fffffffffffffba0;
          SVar10.endLoc._7_1_ = in_stack_fffffffffffffbaf;
          local_240 = in_stack_fffffffffffffc30;
          Diagnostic::addNote(in_stack_fffffffffffffb98,in_stack_fffffffffffffbb4,SVar10);
          sVar9 = local_218;
        }
        else {
          SVar10 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffbd0);
          *(SourceRange *)(in_RDI + 400) = SVar10;
          local_208 = SVar10;
          std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
          span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                    ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                      *)in_stack_fffffffffffffb90,
                     (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffb88
                    );
          local_238 = local_178;
          syntax._M_ptr._7_1_ = in_stack_fffffffffffffbaf;
          syntax._M_ptr._0_7_ = in_stack_fffffffffffffba8;
          syntax._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffbb0;
          syntax._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffbb4;
          lookupLocation_00._8_8_ = in_stack_fffffffffffffba0;
          lookupLocation_00.scope = (Scope *)in_stack_fffffffffffffb98;
          sVar9 = AttributeSymbol::fromSyntax
                            (syntax,(Scope *)in_stack_fffffffffffffb90,lookupLocation_00);
          *(span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
           (in_RDI + 0x180) = sVar9;
        }
      }
      else {
        in_stack_fffffffffffffc28 =
             (SourceLocation)
             slang::syntax::SyntaxNode::as<slang::syntax::NamedPortConnectionSyntax>
                       (&local_1d0->super_SyntaxNode);
        local_280 = in_stack_fffffffffffffc28;
        sVar11 = parsing::Token::valueText((Token *)in_stack_fffffffffffffb90);
        local_290._M_str = sVar11._M_str;
        in_stack_fffffffffffffc20 = (Scope *)sVar11._M_len;
        local_290._M_len = (size_t)in_stack_fffffffffffffc20;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_290);
        sVar9 = local_218;
        if (!bVar1) {
          in_stack_fffffffffffffbd0 = (SyntaxNode *)(in_RDI + 0x148);
          pVar12 = std::make_pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>
                             ((NamedPortConnectionSyntax **)in_stack_fffffffffffffb80,
                              (bool *)in_stack_fffffffffffffb78);
          this_00 = pVar12.first;
          uVar6 = pVar12.second;
          local_160 = &local_290;
          local_168 = &local_2b8;
          args = in_stack_fffffffffffffbd0;
          local_2b8._M_len = (size_t)this_00;
          local_2b8._M_str._0_1_ = uVar6;
          local_158 = in_stack_fffffffffffffbd0;
          local_140 = local_168;
          local_138 = local_160;
          local_130 = in_stack_fffffffffffffbd0;
          pSVar3 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                   ::al((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                         *)0x7a8eee);
          boost::unordered::detail::foa::
          alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
          ::alloc_cted_or_fwded_key_type(&local_148,pSVar3,local_138);
          local_78 = boost::unordered::detail::foa::
                     alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>,_std::basic_string_view<char,_std::char_traits<char>_>_&,_void>
                     ::move_or_fwd(&local_148);
          local_70 = &local_149;
          local_80 = local_140;
          local_68 = in_stack_fffffffffffffbd0;
          local_88 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                     ::
                     key_from<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                               (local_78,local_140);
          args_1 = (basic_string_view<char,_std::char_traits<char>_> *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                   ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                               *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          local_90 = args_1;
          local_98 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                     ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                     *)in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
          local_10 = local_88;
          local_20 = local_90;
          args_2 = in_stack_fffffffffffffbd0;
          local_18 = local_98;
          local_8 = in_stack_fffffffffffffbd0;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_30,local_98);
          do {
            local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
            local_40 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                       ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)0x7a904b);
            local_40 = local_40 + local_38;
            uVar2 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffffb88,(size_t)in_stack_fffffffffffffb80);
            local_44 = uVar2;
            if (uVar2 != 0) {
              local_50 = boost::unordered::detail::foa::
                         table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                         ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                     *)0x7a90a4);
              local_58 = local_50 + local_38 * 0xf;
              do {
                local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                peVar4 = boost::unordered::detail::foa::
                         table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                         ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                                 *)0x7a90f4);
                in_stack_fffffffffffffbb0 = SUB84(peVar4,0);
                in_stack_fffffffffffffbb4 = SUB84((ulong)peVar4 >> 0x20,0);
                in_stack_fffffffffffffbc0 =
                     (Diagnostic *)
                     boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
                     ::
                     key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>>
                               ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>
                                 *)0x7a9121);
                bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_fffffffffffffba0,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffffb98,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffffb90);
                if (bVar1) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
                  ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
                  goto LAB_007a9228;
                }
                local_44 = local_44 - 1 & local_44;
              } while (local_44 != 0);
            }
            in_stack_fffffffffffffbaf =
                 boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffb80,(size_t)in_stack_fffffffffffffb78);
            if ((bool)in_stack_fffffffffffffbaf) {
              memset(&local_b0,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
              ::table_locator(&local_b0);
              goto LAB_007a9228;
            }
            bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_30,(size_t)in_stack_fffffffffffffbd0->previewNode);
          } while (bVar1);
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>_>
          ::table_locator(&local_b0);
LAB_007a9228:
          bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                            ((table_locator *)&local_b0);
          if (bVar1) {
            local_c0 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                       ::make_iterator((locator *)0x7a9248);
            local_c1 = false;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_2a8,&local_c0,&local_c1);
          }
          else if (*(SyntaxNode **)(args_2 + 2) < args_2[1].previewNode) {
            in_stack_fffffffffffffb78 = local_80;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                      ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                       (size_t)in_stack_fffffffffffffba0,
                       (try_emplace_args_t *)in_stack_fffffffffffffb98,
                       (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb90
                       ,(pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool> *)
                        in_stack_fffffffffffffbc0);
            local_d8 = boost::unordered::detail::foa::
                       table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                       ::make_iterator((locator *)0x7a92e4);
            local_f1[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_2a8,&local_d8,local_f1);
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>,256ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,std::pair<slang::syntax::NamedPortConnectionSyntax_const*,bool>>
                      ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        *)this_00,CONCAT17(uVar6,in_stack_fffffffffffffc08),
                       (try_emplace_args_t *)args,args_1,
                       (pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool> *)args_2);
            local_108 = boost::unordered::detail::foa::
                        table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_256UL,_16UL>_>
                        ::make_iterator((locator *)0x7a935c);
            local_121[0] = true;
            std::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
            ::
            pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                      (&local_2a8,&local_108,local_121);
          }
          sVar9 = local_218;
          if ((local_2a8.second & 1U) == 0) {
            in_stack_fffffffffffffb98 = local_190;
            in_stack_fffffffffffffba0 = parsing::Token::location((Token *)((long)local_280 + 0x60));
            in_stack_fffffffffffffb80 =
                 Scope::addDiag(in_stack_fffffffffffffc20,
                                SUB84((ulong)in_stack_fffffffffffffc30 >> 0x20,0),
                                in_stack_fffffffffffffc28);
            sVar11._M_len._4_4_ = uVar2;
            sVar11._M_len._0_4_ = in_stack_fffffffffffffbc8;
            sVar11._M_str = (char *)in_stack_fffffffffffffbd0;
            in_stack_fffffffffffffb90 = in_stack_fffffffffffffb80;
            Diagnostic::operator<<(in_stack_fffffffffffffbc0,sVar11);
            ppVar5 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedPortConnectionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                   *)in_stack_fffffffffffffb80);
            in_stack_fffffffffffffb88 = parsing::Token::location(&((ppVar5->second).first)->name);
            Diagnostic::addNote(in_stack_fffffffffffffb80,
                                SUB84((ulong)in_stack_fffffffffffffb90 >> 0x20,0),
                                in_stack_fffffffffffffb88);
            sVar9 = local_218;
          }
        }
      }
    }
    else {
      SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*>::push_back
                ((SmallVectorBase<const_slang::syntax::PortConnectionSyntax_*> *)
                 in_stack_fffffffffffffb80,(PortConnectionSyntax **)in_stack_fffffffffffffb78);
      sVar9 = local_218;
    }
    local_218 = sVar9;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<const_slang::syntax::PortConnectionSyntax_*>,_false>
                *)in_stack_fffffffffffffb80);
    cVar8.index = local_350;
    cVar8.list = (ParentList *)this_01;
  } while( true );
}

Assistant:

PortConnection::ConnMap::ConnMap(
    const syntax::SeparatedSyntaxList<syntax::PortConnectionSyntax>& portConnections,
    const Scope& scope, LookupLocation lookupLocation) {

    bool hasConnections = false;
    for (auto conn : portConnections) {
        bool isOrdered = conn->kind == SyntaxKind::OrderedPortConnection ||
                         conn->kind == SyntaxKind::EmptyPortConnection;
        if (!hasConnections) {
            hasConnections = true;
            usingOrdered = isOrdered;
        }
        else if (isOrdered != usingOrdered) {
            scope.addDiag(diag::MixingOrderedAndNamedPorts, conn->getFirstToken().location());
            break;
        }

        if (isOrdered) {
            orderedConns.push_back(conn);
        }
        else if (conn->kind == SyntaxKind::WildcardPortConnection) {
            if (!std::exchange(hasWildcard, true)) {
                wildcardRange = conn->sourceRange();
                wildcardAttrs = AttributeSymbol::fromSyntax(conn->attributes, scope,
                                                            lookupLocation);
            }
            else {
                auto& diag = scope.addDiag(diag::DuplicateWildcardPortConnection,
                                           conn->sourceRange());
                diag.addNote(diag::NotePreviousUsage, wildcardRange);
            }
        }
        else {
            auto& npc = conn->as<NamedPortConnectionSyntax>();
            auto name = npc.name.valueText();
            if (!name.empty()) {
                auto pair = namedConns.emplace(name, std::make_pair(&npc, false));
                if (!pair.second) {
                    auto& diag = scope.addDiag(diag::DuplicatePortConnection, npc.name.location());
                    diag << name;
                    diag.addNote(diag::NotePreviousUsage,
                                 pair.first->second.first->name.location());
                }
            }
        }
    }
}